

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::RepeatLoopFixedInst::Exec
          (RepeatLoopFixedInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  BeginLoopFixedInst *pBVar5;
  LoopInfo *pLVar6;
  Cont *pCVar7;
  undefined4 *puVar8;
  uint8 *puVar9;
  char *pcVar10;
  uint uVar11;
  Label LVar12;
  
  pBVar5 = Matcher::LabelToInstPointer<UnifiedRegex::BeginLoopFixedInst>
                     (matcher,BeginLoopFixed,(this->super_RepeatLoopMixin).beginLabel);
  pLVar6 = Matcher::LoopIdToLoopInfo
                     (matcher,(pBVar5->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId);
  uVar11 = pLVar6->number + 1;
  pLVar6->number = uVar11;
  uVar1 = (pBVar5->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower;
  if (uVar1 <= uVar11) {
    uVar2 = (pBVar5->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.upper;
    if ((uVar2 != 0xffffffff) && (uVar2 <= uVar11)) {
      if (uVar1 < uVar2) {
        pCVar7 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Top
                           (&contStack->
                             super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
        if (pCVar7 == (Cont *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                             ,0xd20,"(top != 0)","top != 0");
          if (!bVar4) goto LAB_00d4e334;
          *puVar8 = 0;
        }
        if (pCVar7->tag != RewindLoopFixed) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                             ,0xd21,"(top->tag == Cont::ContTag::RewindLoopFixed)",
                             "top->tag == Cont::ContTag::RewindLoopFixed");
          if (!bVar4) {
LAB_00d4e334:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar8 = 0;
        }
        *(undefined1 *)&pCVar7[1]._vptr_Cont = 0;
      }
      LVar12 = (pBVar5->super_BeginLoopMixin).exitLabel;
      goto LAB_00d4e2d4;
    }
    if (uVar11 == uVar1) {
      pcVar10 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
                Push<UnifiedRegex::RewindLoopFixedCont>
                          (&contStack->
                            super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
      LVar12 = (this->super_RepeatLoopMixin).beginLabel;
      pcVar10[8] = '\a';
      *(undefined ***)pcVar10 = &PTR_Print_013e0308;
      *(Label *)(pcVar10 + 0xc) = LVar12;
      pcVar10[0x10] = '\x01';
      Matcher::PushStats(matcher,contStack,input);
    }
  }
  LVar12 = (this->super_RepeatLoopMixin).beginLabel + 0x17;
LAB_00d4e2d4:
  puVar9 = Matcher::LabelToInstPointer(matcher,LVar12);
  *instPointer = puVar9;
  return false;
}

Assistant:

inline bool RepeatLoopFixedInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginLoopFixedInst* begin = matcher.L2I(BeginLoopFixed, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        loopInfo->number++;

        if (loopInfo->number < begin->repeats.lower)
        {
            // Must match another iteration of body. Failure of body signals failure of the entire loop.
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopFixedInst));
        }
        else if (begin->repeats.upper != CharCountFlag && loopInfo->number >= (CharCount)begin->repeats.upper)
        {
            // Matched maximum number of iterations. Continue with follow.
            if (begin->repeats.lower < begin->repeats.upper)
            {
                // Failure of follow will try one fewer iterations (subject to repeats.lower).
                // Since loop body is non-deterministic and does not define groups the rewind continuation must be on top of the stack.
                Cont *top = contStack.Top();
                Assert(top != 0);
                Assert(top->tag == Cont::ContTag::RewindLoopFixed);
                RewindLoopFixedCont* rewind = (RewindLoopFixedCont*)top;
                rewind->tryingBody = false;
            }
            // else: we never pushed a rewind continuation
            instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        }
        else
        {
            // CHOICEPOINT: Try one more iteration of body. Failure of body will rewind input to here and
            // try follow.
            if (loopInfo->number == begin->repeats.lower)
            {
                // i.e. begin->repeats.lower > 0, so continuation won't have been pushed in BeginLoopFixed
                PUSH(contStack, RewindLoopFixedCont, beginLabel, true);
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.PushStats(contStack, input);
#endif
            }
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopFixedInst));
        }
        return false;
    }